

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pagerLockDb(Pager *pPager,int eLock)

{
  int local_1c;
  int local_18;
  int rc;
  int eLock_local;
  Pager *pPager_local;
  
  local_18 = 0;
  if (((int)(uint)pPager->eLock < eLock) || (pPager->eLock == '\x05')) {
    if (pPager->noLock == '\0') {
      local_1c = sqlite3OsLock(pPager->fd,eLock);
    }
    else {
      local_1c = 0;
    }
    local_18 = local_1c;
    if ((local_1c == 0) && ((pPager->eLock != '\x05' || (eLock == 4)))) {
      pPager->eLock = (u8)eLock;
    }
  }
  return local_18;
}

Assistant:

static int pagerLockDb(Pager *pPager, int eLock){
  int rc = SQLITE_OK;

  assert( eLock==SHARED_LOCK || eLock==RESERVED_LOCK || eLock==EXCLUSIVE_LOCK );
  if( pPager->eLock<eLock || pPager->eLock==UNKNOWN_LOCK ){
    rc = pPager->noLock ? SQLITE_OK : sqlite3OsLock(pPager->fd, eLock);
    if( rc==SQLITE_OK && (pPager->eLock!=UNKNOWN_LOCK||eLock==EXCLUSIVE_LOCK) ){
      pPager->eLock = (u8)eLock;
      IOTRACE(("LOCK %p %d\n", pPager, eLock))
    }
  }
  return rc;
}